

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O3

void duckdb::DisabledFilesystemsSetting::SetGlobal
               (DatabaseInstance *db,DBConfig *config,Value *input)

{
  FileSystem *pFVar1;
  InternalException *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> list
  ;
  string local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_58;
  string local_40;
  
  if (db != (DatabaseInstance *)0x0) {
    pFVar1 = FileSystem::GetFileSystem(db);
    Value::ToString_abi_cxx11_(&local_78,input);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,",","");
    StringUtil::Split(&local_58,&local_78,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    (*pFVar1->_vptr_FileSystem[0x28])(pFVar1,&local_58);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_58);
    return;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"disabled_filesystems can only be set in an active database","");
  InternalException::InternalException(this,&local_78);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DisabledFilesystemsSetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	if (!db) {
		throw InternalException("disabled_filesystems can only be set in an active database");
	}
	auto &fs = FileSystem::GetFileSystem(*db);
	auto list = StringUtil::Split(input.ToString(), ",");
	fs.SetDisabledFileSystems(list);
}